

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O3

void __thiscall
QNetworkReplyImplPrivate::appendDownstreamData(QNetworkReplyImplPrivate *this,QIODevice *data)

{
  char *pcVar1;
  char cVar2;
  long in_FS_OFFSET;
  Connection CStack_38;
  QObject local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = *(char **)&(this->super_QNetworkReplyPrivate).field_0x8;
  cVar2 = QIODevice::isOpen();
  if (cVar2 != '\0') {
    if (this->copyDevice == (QIODevice *)0x0) {
      this->copyDevice = data;
      QObject::connect(local_30,(char *)data,(QObject *)"2readyRead()",pcVar1,0x25cb6f);
      QMetaObject::Connection::~Connection((Connection *)local_30);
      QObject::connect((QObject *)&CStack_38,(char *)this->copyDevice,
                       (QObject *)"2readChannelFinished()",pcVar1,0x25cb83);
      QMetaObject::Connection::~Connection(&CStack_38);
      _q_copyReadyRead(this);
    }
    else {
      appendDownstreamData();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyImplPrivate::appendDownstreamData(QIODevice *data)
{
    Q_Q(QNetworkReplyImpl);
    if (!q->isOpen())
        return;

    // read until EOF from data
    if (Q_UNLIKELY(copyDevice)) {
        qCritical("QNetworkReplyImpl: copy from QIODevice already in progress -- "
                  "backend probably needs to be fixed");
        return;
    }

    copyDevice = data;
    q->connect(copyDevice, SIGNAL(readyRead()), SLOT(_q_copyReadyRead()));
    q->connect(copyDevice, SIGNAL(readChannelFinished()), SLOT(_q_copyReadChannelFinished()));

    // start the copy:
    _q_copyReadyRead();
}